

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassFullName
          (string *__return_storage_ptr__,ClassNameResolver *this,string *name_without_package,
          FileDescriptor *file,bool immutable,bool multiple_files)

{
  undefined3 in_register_00000089;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (CONCAT31(in_register_00000089,multiple_files) == 0) {
    GetClassName_abi_cxx11_(&local_40,this,file,immutable);
  }
  else {
    FileJavaPackage_abi_cxx11_
              (&local_40,(java *)file,(FileDescriptor *)(ulong)immutable,SUB81(file,0));
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(name_without_package->_M_dataplus)._M_p);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetClassFullName(const string& name_without_package,
                                           const FileDescriptor* file,
                                           bool immutable,
                                           bool multiple_files) {
  string result;
  if (multiple_files) {
    result = FileJavaPackage(file, immutable);
  } else {
    result = GetClassName(file, immutable);
  }
  if (!result.empty()) {
    result += '.';
  }
  result += name_without_package;
  return result;
}